

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O3

void __thiscall
basisu::image_metrics::calc
          (image_metrics *this,image *a,image *b,uint32_t first_chan,uint32_t total_chans,
          bool avg_comp_error,bool use_601_luma)

{
  uint uVar1;
  uint uVar2;
  color_rgba *pcVar3;
  color_rgba *pcVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  uint32_t uVar9;
  ulong uVar10;
  uint32_t uVar11;
  uint8_t *puVar12;
  long lVar13;
  uint8_t *puVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  float fVar23;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  double dVar25;
  float fVar26;
  double dVar27;
  double hist [256];
  uint local_8b4;
  uint local_8b0;
  ulong local_898;
  double local_838 [257];
  
  if ((3 < first_chan) || (4 < total_chans + first_chan)) {
    __assert_fail("(first_chan < 4U) && (first_chan + total_chans <= 4U)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                  ,0x56b,
                  "void basisu::image_metrics::calc(const image &, const image &, uint32_t, uint32_t, bool, bool)"
                 );
  }
  uVar5 = b->m_width;
  if (a->m_width < b->m_width) {
    uVar5 = a->m_width;
  }
  uVar6 = b->m_height;
  if (a->m_height < b->m_height) {
    uVar6 = a->m_height;
  }
  local_898 = 0;
  memset(local_838,0,0x800);
  if (uVar6 != 0) {
    uVar9 = a->m_pitch;
    uVar1 = (a->m_pixels).m_size;
    pcVar3 = (a->m_pixels).m_p;
    uVar11 = b->m_pitch;
    uVar2 = (b->m_pixels).m_size;
    pcVar4 = (b->m_pixels).m_p;
    iVar15 = 0x3672;
    if (use_601_luma) {
      iVar15 = 0x4c8b;
    }
    iVar16 = 0xb715;
    if (use_601_luma) {
      iVar16 = 0x9646;
    }
    iVar17 = 0x1279;
    if (use_601_luma) {
      iVar17 = 0x1d2f;
    }
    local_8b0 = 0;
    local_8b4 = 0;
    do {
      if (uVar5 != 0) {
        puVar14 = pcVar3[local_8b0].field_0.m_comps + first_chan;
        puVar12 = pcVar4[local_898].field_0.m_comps + first_chan;
        uVar20 = 0;
        do {
          uVar8 = uVar9 * local_8b4 + (int)uVar20;
          if ((uVar1 <= uVar8) || (uVar19 = uVar11 * local_8b4 + (int)uVar20, uVar2 <= uVar19)) {
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x177,
                          "const T &basisu::vector<basisu::color_rgba>::operator[](size_t) const [T = basisu::color_rgba]"
                         );
          }
          if (total_chans == 0) {
            uVar19 = ((uint)pcVar3[uVar8].field_0.m_comps[2] * iVar17 + 0x8000 +
                      (uint)pcVar3[uVar8].field_0.m_comps[1] * iVar16 +
                      (uint)pcVar3[uVar8].field_0.m_comps[0] * iVar15 >> 0x10) -
                     ((uint)pcVar4[uVar19].field_0.m_comps[2] * iVar17 + 0x8000 +
                      (uint)pcVar4[uVar19].field_0.m_comps[1] * iVar16 +
                      (uint)pcVar4[uVar19].field_0.m_comps[0] * iVar15 >> 0x10);
            uVar8 = -uVar19;
            if (0 < (int)uVar19) {
              uVar8 = uVar19;
            }
            local_838[uVar8] = local_838[uVar8] + 1.0;
          }
          else {
            uVar10 = 0;
            do {
              if (4 - first_chan == uVar10) {
                __assert_fail("index < 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                              ,0x374,"const uint8_t &basisu::color_rgba::operator[](uint32_t) const"
                             );
              }
              bVar7 = (byte)((uint)puVar14[uVar10] - (uint)puVar12[uVar10]);
              bVar18 = -bVar7;
              if (0 < (int)((uint)puVar14[uVar10] - (uint)puVar12[uVar10])) {
                bVar18 = bVar7;
              }
              local_838[bVar18] = local_838[bVar18] + 1.0;
              uVar10 = uVar10 + 1;
            } while (total_chans != uVar10);
          }
          uVar20 = uVar20 + 1;
          puVar14 = puVar14 + 4;
          puVar12 = puVar12 + 4;
        } while (uVar20 != uVar5);
      }
      local_8b4 = local_8b4 + 1;
      local_8b0 = local_8b0 + uVar9;
      local_898 = (ulong)((int)local_898 + uVar11);
    } while (local_8b4 != uVar6);
  }
  this->m_max = 0.0;
  auVar22 = ZEXT816(0);
  fVar23 = 0.0;
  lVar13 = 0;
  do {
    dVar25 = local_838[lVar13];
    if ((dVar25 != 0.0) || (NAN(dVar25))) {
      fVar26 = (float)(int)lVar13;
      if (fVar23 <= fVar26) {
        fVar23 = fVar26;
      }
      this->m_max = fVar23;
      dVar27 = (double)(int)lVar13;
      dVar25 = dVar25 * dVar27;
      dVar21 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + dVar25;
      auVar22._8_8_ = dVar21 + dVar27 * dVar25;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x100);
  dVar25 = (double)uVar6 * (double)uVar5;
  if (avg_comp_error) {
    uVar9 = 4;
    if (total_chans < 4) {
      uVar9 = total_chans;
    }
    uVar11 = 1;
    if (total_chans != 0) {
      uVar11 = uVar9;
    }
    dVar25 = dVar25 * (double)(int)uVar11;
  }
  auVar24._8_4_ = SUB84(dVar25,0);
  auVar24._0_8_ = dVar25;
  auVar24._12_4_ = (int)((ulong)dVar25 >> 0x20);
  auVar22 = divpd(auVar22,auVar24);
  auVar24 = minpd(_DAT_0031ae30,auVar22);
  fVar23 = (float)(double)(-(ulong)(0.0 <= auVar22._8_8_) & auVar24._8_8_);
  this->m_mean = (float)(double)(-(ulong)(0.0 <= auVar22._0_8_) & auVar24._0_8_);
  this->m_mean_squared = fVar23;
  if (fVar23 < 0.0) {
    fVar23 = sqrtf(fVar23);
  }
  else {
    fVar23 = SQRT(fVar23);
  }
  this->m_rms = fVar23;
  if ((fVar23 != 0.0) || (NAN(fVar23))) {
    dVar21 = log10(255.0 / (double)fVar23);
    dVar21 = dVar21 * 20.0;
    dVar25 = 100.0;
    if (dVar21 <= 100.0) {
      dVar25 = dVar21;
    }
    fVar23 = (float)(double)(~-(ulong)(dVar21 < 0.0) & (ulong)dVar25);
  }
  else {
    fVar23 = 100.0;
  }
  this->m_psnr = fVar23;
  return;
}

Assistant:

void image_metrics::calc(const image &a, const image &b, uint32_t first_chan, uint32_t total_chans, bool avg_comp_error, bool use_601_luma)
	{
		assert((first_chan < 4U) && (first_chan + total_chans <= 4U));

		const uint32_t width = basisu::minimum(a.get_width(), b.get_width());
		const uint32_t height = basisu::minimum(a.get_height(), b.get_height());

		double hist[256];
		clear_obj(hist);

		for (uint32_t y = 0; y < height; y++)
		{
			for (uint32_t x = 0; x < width; x++)
			{
				const color_rgba &ca = a(x, y), &cb = b(x, y);

				if (total_chans)
				{
					for (uint32_t c = 0; c < total_chans; c++)
						hist[iabs(ca[first_chan + c] - cb[first_chan + c])]++;
				}
				else
				{
					if (use_601_luma)
						hist[iabs(ca.get_601_luma() - cb.get_601_luma())]++;
					else
						hist[iabs(ca.get_709_luma() - cb.get_709_luma())]++;
				}
			}
		}

		m_max = 0;
		double sum = 0.0f, sum2 = 0.0f;
		for (uint32_t i = 0; i < 256; i++)
		{
			if (hist[i])
			{
				m_max = basisu::maximum<float>(m_max, (float)i);
				double v = i * hist[i];
				sum += v;
				sum2 += i * v;
			}
		}

		double total_values = (double)width * (double)height;
		if (avg_comp_error)
			total_values *= (double)clamp<uint32_t>(total_chans, 1, 4);

		m_mean = (float)clamp<double>(sum / total_values, 0.0f, 255.0);
		m_mean_squared = (float)clamp<double>(sum2 / total_values, 0.0f, 255.0f * 255.0f);
		m_rms = (float)sqrt(m_mean_squared);
		m_psnr = m_rms ? (float)clamp<double>(log10(255.0 / m_rms) * 20.0f, 0.0f, 100.0f) : 100.0f;
	}